

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::Matchers::Floating::WithinRelMatcher::WithinRelMatcher
          (WithinRelMatcher *this,double target,double epsilon)

{
  ReusableStringStream *pRVar1;
  ReusableStringStream local_a0;
  string local_88;
  ReusableStringStream local_58;
  string local_40;
  double local_20;
  double epsilon_local;
  double target_local;
  WithinRelMatcher *this_local;
  
  local_20 = epsilon;
  epsilon_local = target;
  target_local = (double)this;
  Impl::MatcherBase<double>::MatcherBase(&this->super_MatcherBase<double>);
  (this->super_MatcherBase<double>).super_MatcherUntypedBase._vptr_MatcherUntypedBase =
       (_func_int **)&PTR__WithinRelMatcher_003e6608;
  (this->super_MatcherBase<double>).super_MatcherMethod<double>._vptr_MatcherMethod =
       (_func_int **)&DAT_003e6638;
  this->m_target = epsilon_local;
  this->m_epsilon = local_20;
  if (this->m_epsilon < 0.0) {
    ReusableStringStream::ReusableStringStream(&local_58);
    pRVar1 = ReusableStringStream::operator<<
                       (&local_58,
                        (char (*) [59])"Relative comparison with epsilon <  0 does not make sense.")
    ;
    ReusableStringStream::str_abi_cxx11_(&local_40,pRVar1);
    throw_domain_error(&local_40);
  }
  if (1.0 < this->m_epsilon || this->m_epsilon == 1.0) {
    ReusableStringStream::ReusableStringStream(&local_a0);
    pRVar1 = ReusableStringStream::operator<<
                       (&local_a0,
                        (char (*) [59])"Relative comparison with epsilon >= 1 does not make sense.")
    ;
    ReusableStringStream::str_abi_cxx11_(&local_88,pRVar1);
    throw_domain_error(&local_88);
  }
  return;
}

Assistant:

WithinRelMatcher::WithinRelMatcher(double target, double epsilon) :
                m_target(target),
                m_epsilon(epsilon) {
                CATCH_ENFORCE(m_epsilon >= 0., "Relative comparison with epsilon <  0 does not make sense.");
                CATCH_ENFORCE(m_epsilon < 1., "Relative comparison with epsilon >= 1 does not make sense.");
            }